

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

Definition * __thiscall cppforth::Forth::definitionsAt(Forth *this,Cell index)

{
  ulong uVar1;
  pointer pDVar2;
  ulong uVar3;
  string local_48;
  
  uVar1 = (ulong)index;
  pDVar2 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 4) *
          -0x3333333333333333;
  if (uVar3 < uVar1 || uVar3 - uVar1 == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Access to definitions out of range","");
    throwCppExceptionMessage(this,&local_48,errorUndefinedWord);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pDVar2 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->definitions).
                   super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 4) *
            -0x3333333333333333;
  }
  if (uVar1 < uVar3) {
    return pDVar2 + uVar1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar1);
}

Assistant:

Definition &definitionsAt(Cell index){
			if (index >= definitions.size() || index<0){
				throwCppExceptionMessage("Access to definitions out of range",errorUndefinedWord);
			}
			return definitions.at(index);
		}